

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O1

void bcread_fill(LexState *ls,MSize len,int need)

{
  SBuf *sb;
  uint uVar1;
  MSize sz_00;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  bool bVar8;
  size_t sz;
  ulong local_38;
  
  if ((len < 0x7fffff01) && (-1 < ls->c)) {
    sb = &ls->sb;
    do {
      uVar7 = (ls->sb).b.ptr32;
      pcVar6 = (char *)(ulong)uVar7;
      pcVar2 = ls->p;
      uVar5 = (long)ls->pe - (long)pcVar2;
      iVar4 = (int)uVar5;
      if (iVar4 != 0) {
        if ((sb->p).ptr32 == uVar7) {
          uVar7 = (ls->sb).b.ptr32;
          pcVar6 = (char *)(ulong)uVar7;
          if ((ls->sb).e.ptr32 - uVar7 < len) {
            pcVar6 = lj_buf_need2(sb,len);
          }
          memcpy(pcVar6,ls->p,uVar5 & 0xffffffff);
        }
        else if (pcVar2 != pcVar6) {
          memmove(pcVar6,pcVar2,uVar5 & 0xffffffff);
        }
        ls->p = pcVar6;
        ls->pe = pcVar6 + (uVar5 & 0xffffffff);
      }
      (ls->sb).p.ptr32 = (int)pcVar6 + iVar4;
      pcVar2 = (*ls->rfunc)(ls->L,ls->rdata,&local_38);
      bVar8 = local_38 == 0;
      if (bVar8 || pcVar2 == (char *)0x0) {
        if (need != 0) break;
        ls->c = -1;
      }
      else {
        if (0x7fffff00 - iVar4 <= local_38) {
          lj_err_mem(ls->L);
        }
        if (iVar4 == 0) {
          ls->p = pcVar2;
          pcVar6 = pcVar2 + local_38;
        }
        else {
          uVar7 = (int)local_38 + iVar4;
          sz_00 = len;
          if (len < uVar7) {
            sz_00 = uVar7;
          }
          uVar1 = (ls->sb).b.ptr32;
          pcVar3 = (char *)(ulong)uVar1;
          if ((ls->sb).e.ptr32 - uVar1 < sz_00) {
            pcVar3 = lj_buf_need2(sb,sz_00);
          }
          memcpy((void *)(ulong)(ls->sb).p.ptr32,pcVar2,local_38);
          pcVar6 = pcVar3 + uVar7;
          (ls->sb).p.ptr32 = (uint32_t)pcVar6;
          ls->p = pcVar3;
        }
        ls->pe = pcVar6;
      }
      if ((bVar8 || pcVar2 == (char *)0x0) || (len <= (uint)(*(int *)&ls->pe - *(int *)&ls->p))) {
        return;
      }
    } while( true );
  }
  bcread_error(ls,LJ_ERR_BCBAD);
}

Assistant:

static LJ_NOINLINE void bcread_fill(LexState *ls, MSize len, int need)
{
  lj_assertLS(len != 0, "empty refill");
  if (len > LJ_MAX_BUF || ls->c < 0)
    bcread_error(ls, LJ_ERR_BCBAD);
  do {
    const char *buf;
    size_t sz;
    char *p = sbufB(&ls->sb);
    MSize n = (MSize)(ls->pe - ls->p);
    if (n) {  /* Copy remainder to buffer. */
      if (sbuflen(&ls->sb)) {  /* Move down in buffer. */
	lj_assertLS(ls->pe == sbufP(&ls->sb), "bad buffer pointer");
	if (ls->p != p) memmove(p, ls->p, n);
      } else {  /* Copy from buffer provided by reader. */
	p = lj_buf_need(&ls->sb, len);
	memcpy(p, ls->p, n);
      }
      ls->p = p;
      ls->pe = p + n;
    }
    setsbufP(&ls->sb, p + n);
    buf = ls->rfunc(ls->L, ls->rdata, &sz);  /* Get more data from reader. */
    if (buf == NULL || sz == 0) {  /* EOF? */
      if (need) bcread_error(ls, LJ_ERR_BCBAD);
      ls->c = -1;  /* Only bad if we get called again. */
      break;
    }
    if (sz >= LJ_MAX_BUF - n) lj_err_mem(ls->L);
    if (n) {  /* Append to buffer. */
      n += (MSize)sz;
      p = lj_buf_need(&ls->sb, n < len ? len : n);
      memcpy(sbufP(&ls->sb), buf, sz);
      setsbufP(&ls->sb, p + n);
      ls->p = p;
      ls->pe = p + n;
    } else {  /* Return buffer provided by reader. */
      ls->p = buf;
      ls->pe = buf + sz;
    }
  } while ((MSize)(ls->pe - ls->p) < len);
}